

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeWeakSetConstructor
               (DynamicObject *weakSetConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  Var value;
  DynamicObject **ppDVar1;
  PropertyString *value_00;
  ScriptContext *scriptContext;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *weakSetConstructor_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,weakSetConstructor,mode,3,0);
  this = RecyclableObject::GetLibrary(&weakSetConstructor->super_RecyclableObject);
  this_00 = RecyclableObject::GetScriptContext(&weakSetConstructor->super_RecyclableObject);
  value = TaggedInt::ToVarUnchecked(0);
  AddMember(this,weakSetConstructor,0xd1,value,'\x02');
  ppDVar1 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).weakSetPrototype);
  AddMember(this,weakSetConstructor,0x124,*ppDVar1,'\0');
  value_00 = ScriptContext::GetPropertyString(this_00,0x191);
  AddMember(this,weakSetConstructor,0x106,value_00,'\x02');
  DynamicObject::SetHasNoEnumerableProperties(weakSetConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeWeakSetConstructor(DynamicObject* weakSetConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(weakSetConstructor, mode, 3);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterWeakSet
        // so that the update is in sync with profiler
        JavascriptLibrary* library = weakSetConstructor->GetLibrary();
        ScriptContext* scriptContext = weakSetConstructor->GetScriptContext();
        library->AddMember(weakSetConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(0), PropertyConfigurable);
        library->AddMember(weakSetConstructor, PropertyIds::prototype, library->weakSetPrototype, PropertyNone);
        library->AddMember(weakSetConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::WeakSet), PropertyConfigurable);

        weakSetConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }